

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isPossibleExpression(TokenKind kind)

{
  bool bVar1;
  SyntaxKind SVar2;
  TokenKind in_DI;
  SyntaxKind opKind;
  bool local_1;
  
  if ((((((((ushort)(in_DI - Identifier) < 8) || ((ushort)(in_DI - ApostropheOpenBrace) < 2)) ||
         (in_DI == OpenBracket)) || ((in_DI == OpenParenthesis || (in_DI == DoubleColon)))) ||
       (((ushort)(in_DI - Dollar) < 4 || ((in_DI == At || (in_DI == TripleAnd)))))) ||
      (in_DI == DistKeyword)) ||
     (((((in_DI == InsideKeyword || (in_DI == LocalKeyword)) || (in_DI == MatchesKeyword)) ||
       (((in_DI == NullKeyword || (in_DI == RepeatKeyword)) ||
        ((in_DI == SuperKeyword || ((in_DI == TaggedKeyword || (in_DI == ThisKeyword)))))))) ||
      ((in_DI == TypeKeyword || (in_DI == UnitSystemName || in_DI == RootSystemName)))))) {
    local_1 = true;
  }
  else {
    bVar1 = isPossibleDataType(in_DI);
    if (bVar1) {
      local_1 = true;
    }
    else {
      SVar2 = getUnaryPrefixExpression(in_DI);
      if (SVar2 == Unknown) {
        SVar2 = getBinaryExpression(in_DI);
        if (SVar2 == Unknown) {
          local_1 = false;
        }
        else {
          local_1 = true;
        }
      }
      else {
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isPossibleExpression(TokenKind kind) {
    switch (kind) {
        case TokenKind::TaggedKeyword:
        case TokenKind::StringLiteral:
        case TokenKind::IntegerLiteral:
        case TokenKind::UnbasedUnsizedLiteral:
        case TokenKind::IntegerBase:
        case TokenKind::RealLiteral:
        case TokenKind::TimeLiteral:
        case TokenKind::NullKeyword:
        case TokenKind::Dollar:
        case TokenKind::LocalKeyword:
        case TokenKind::OpenParenthesis:
        case TokenKind::OpenBrace:
        case TokenKind::OpenBracket:
        case TokenKind::UnitSystemName:
        case TokenKind::ThisKeyword:
        case TokenKind::SuperKeyword:
        case TokenKind::Identifier:
        case TokenKind::SystemIdentifier:
        case TokenKind::RootSystemName:
        case TokenKind::Hash:
        case TokenKind::DoubleHash:
        case TokenKind::At:
        case TokenKind::RepeatKeyword:
        case TokenKind::TypeKeyword:
        case TokenKind::ApostropheOpenBrace:
            // expressions can't actually start with these, but we'll allow it
            // to provide good error handling
        case TokenKind::DoubleColon:
        case TokenKind::Question:
        case TokenKind::MatchesKeyword:
        case TokenKind::TripleAnd:
        case TokenKind::InsideKeyword:
        case TokenKind::DistKeyword:
            return true;
        default:
            break;
    }

    if (isPossibleDataType(kind))
        return true;

    SyntaxKind opKind = getUnaryPrefixExpression(kind);
    if (opKind != SyntaxKind::Unknown)
        return true;

    opKind = getBinaryExpression(kind);
    if (opKind != SyntaxKind::Unknown)
        return true;

    return false;
}